

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cpp
# Opt level: O3

void sqlcheck::ValidateRiskLevel(Configuration *state)

{
  RiskLevel *in_RDX;
  string local_28;
  
  if (state->risk_level < (RISK_LEVEL_HIGH|RISK_LEVEL_NONE)) {
    RiskLevelToDetailedString_abi_cxx11_(&local_28,(sqlcheck *)&state->risk_level,in_RDX);
    printf("> %s :: %s\n","RISK LEVEL   ",local_28._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p);
    }
    return;
  }
  printf("INVALID RISK LEVEL :: %d\n");
  exit(1);
}

Assistant:

void ValidateRiskLevel(const Configuration &state) {
  if (state.risk_level < RISK_LEVEL_ALL || state.risk_level > RISK_LEVEL_HIGH) {
    printf("INVALID RISK LEVEL :: %d\n", state.risk_level);
    exit(EXIT_FAILURE);
  }
  else {
    printf("> %s :: %s\n", "RISK LEVEL   ",
           RiskLevelToDetailedString(state.risk_level).c_str());
  }
}